

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

int __thiscall cilk_fiber::remove_reference_from_thread(cilk_fiber *this)

{
  long lVar1;
  cilk_fiber_sysdep *in_RDI;
  cilk_fiber_sysdep *self;
  int ref_count;
  
  lVar1 = dec_ref_count(&in_RDI->super_cilk_fiber);
  if ((int)lVar1 == 0) {
    sysdep(&in_RDI->super_cilk_fiber);
    cilk_fiber_sysdep::~cilk_fiber_sysdep(in_RDI);
    __cilkrts_free((void *)0x1095b6);
  }
  return (int)lVar1;
}

Assistant:

int cilk_fiber::remove_reference_from_thread()
{
    int ref_count = dec_ref_count();
    if (ref_count == 0) {
        cilk_fiber_sysdep* self = this->sysdep();
        self->~cilk_fiber_sysdep();
        __cilkrts_free(self);
    }
    return ref_count;
}